

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O2

int __thiscall chatter::Host::shutdown(Host *this,int __fd,int __how)

{
  pointer pPVar1;
  int extraout_EAX;
  Peer *peer;
  pointer peer_00;
  
  pPVar1 = (this->m_peers).super__Vector_base<chatter::Peer,_std::allocator<chatter::Peer>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (peer_00 = (this->m_peers).super__Vector_base<chatter::Peer,_std::allocator<chatter::Peer>_>.
                 _M_impl.super__Vector_impl_data._M_start; peer_00 != pPVar1; peer_00 = peer_00 + 1)
  {
    if (peer_00->m_state == CONNECTED) {
      Protocol::disconnect(&this->m_protocol,peer_00);
    }
    Peer::reset(peer_00);
  }
  this->m_run_threads = false;
  std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::clear(&this->m_peers);
  destroy_socket(this);
  return extraout_EAX;
}

Assistant:

void Host::shutdown()
{
    for (auto &peer : m_peers) {
        if (peer.m_state == PeerState::CONNECTED) {
            m_protocol.disconnect(&peer);
        }
        peer.reset();
    }

    m_run_threads = false;
    m_peers.clear();

    /* TODO(ben): Wait for network thread to stop? */
    destroy_socket();
}